

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOUT_madhu.cpp
# Opt level: O3

vector<Track,_std::allocator<Track>_> *
IOU_tracker(vector<Track,_std::allocator<Track>_> *__return_storage_ptr__,float sigma_l,
           float sigma_h,float sigma_iou,int t_min,
           vector<std::vector<Boundingbox,_std::allocator<Boundingbox>_>,_std::allocator<std::vector<Boundingbox,_std::allocator<Boundingbox>_>_>_>
           *detections)

{
  Boundingbox *pBVar1;
  pointer pBVar2;
  pointer pBVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  Boundingbox box1;
  Boundingbox box2;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  float fVar12;
  ulong uVar13;
  pointer pBVar14;
  pointer __x;
  pointer pTVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  float fVar20;
  float fVar21;
  Track track;
  vector<Track,_std::allocator<Track>_> active_tracks;
  vector<Boundingbox,_std::allocator<Boundingbox>_> frame_boxes;
  Boundingbox box;
  vector<Boundingbox,_std::allocator<Boundingbox>_> new_box;
  int local_160;
  value_type local_158;
  vector<Track,_std::allocator<Track>_> *local_130;
  vector<Track,_std::allocator<Track>_> local_128;
  float local_108;
  float local_104;
  vector<Boundingbox,_std::allocator<Boundingbox>_> local_100;
  Boundingbox local_e8;
  void *local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  ulong local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  float local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78;
  Boundingbox local_68;
  vector<Boundingbox,_std::allocator<Boundingbox>_> local_48;
  
  local_128.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_128.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_128.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Track,_std::allocator<Track>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Track,_std::allocator<Track>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Track,_std::allocator<Track>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_130 = __return_storage_ptr__;
  local_108 = sigma_iou;
  std::vector<Boundingbox,_std::allocator<Boundingbox>_>::vector
            (&local_100,*(vector<Boundingbox,_std::allocator<Boundingbox>_> **)detections);
  local_b0 = (ulong)t_min;
  if (local_128.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_128.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar13 = 0;
    local_160 = 0;
    do {
      pTVar15 = local_128.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.
                super__Vector_impl_data._M_start + uVar13;
      std::vector<Boundingbox,_std::allocator<Boundingbox>_>::vector
                (&local_158.boxes,&pTVar15->boxes);
      local_158.track_id = pTVar15->track_id;
      uVar4 = pTVar15->max_score;
      uVar6 = pTVar15->start_frame;
      local_68.x = local_158.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                   _M_impl.super__Vector_impl_data._M_finish[-1].x;
      local_68.y = local_158.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                   _M_impl.super__Vector_impl_data._M_finish[-1].y;
      local_68.w = local_158.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                   _M_impl.super__Vector_impl_data._M_finish[-1].w;
      local_68.h = local_158.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                   _M_impl.super__Vector_impl_data._M_finish[-1].h;
      local_68.score =
           local_158.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].score;
      local_158.max_score = (float)uVar4;
      local_158.start_frame = uVar6;
      std::vector<Boundingbox,_std::allocator<Boundingbox>_>::vector(&local_48,&local_100);
      pBVar2 = local_48.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_e8.x = local_68.x;
      local_e8.y = local_68.y;
      local_e8.w = local_68.w;
      local_e8.h = local_68.h;
      local_e8.score = local_68.score;
      if ((long)local_48.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_48.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                super__Vector_impl_data._M_start == 0) {
        if (local_48.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
LAB_00105b60:
        if ((sigma_h < local_158.max_score) &&
           (uVar18 = ((long)local_158.boxes.
                            super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_158.boxes.
                            super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2) * -0x3333333333333333,
           local_b0 <= uVar18 && uVar18 - local_b0 != 0)) {
          std::vector<Track,_std::allocator<Track>_>::push_back(local_130,&local_158);
        }
        std::vector<Track,_std::allocator<Track>_>::_M_erase
                  (&local_128,
                   local_128.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar13);
      }
      else {
        lVar19 = ((long)local_48.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_48.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
        uVar18 = 0xffffffff;
        fVar20 = 0.0;
        uVar16 = 0;
        pBVar14 = local_48.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          local_b8 = CONCAT44(local_b8._4_4_,pBVar14->score);
          local_c8 = *(void **)pBVar14;
          uStack_c0._0_4_ = pBVar14->w;
          uStack_c0._4_4_ = pBVar14->h;
          box1.w = local_e8.w;
          box1.h = local_e8.h;
          box1.x = local_e8.x;
          box1.y = local_e8.y;
          box1.score = local_e8.score;
          local_104 = fVar20;
          fVar21 = find_IOU(box1,*pBVar14);
          fVar20 = local_104;
          if (local_104 < fVar21) {
            uVar18 = uVar16 & 0xffffffff;
            fVar20 = fVar21;
          }
          uVar16 = uVar16 + 1;
          pBVar14 = pBVar14 + 1;
        } while (lVar19 + (ulong)(lVar19 == 0) != uVar16);
        operator_delete(pBVar2);
        pBVar14 = local_100.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pBVar2 = local_158.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        iVar17 = (int)uVar18;
        if (iVar17 == -1) goto LAB_00105b60;
        pBVar1 = local_158.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                 _M_impl.super__Vector_impl_data._M_finish + -1;
        local_88._0_4_ = pBVar1->x;
        local_88._4_4_ = pBVar1->y;
        uStack_80._0_4_ =
             local_158.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].w;
        uStack_80._4_4_ =
             local_158.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].h;
        local_78 = local_158.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                   _M_impl.super__Vector_impl_data._M_finish[-1].score;
        pBVar3 = local_100.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar17;
        local_a8._0_4_ = pBVar3->x;
        local_a8._4_4_ = pBVar3->y;
        uStack_a0._0_4_ = pBVar3->w;
        uStack_a0._4_4_ = pBVar3->h;
        uVar8 = pBVar3->x;
        uVar9 = pBVar3->y;
        uVar10 = pBVar3->w;
        uVar11 = pBVar3->h;
        box2.h = (float)uVar11;
        box2.w = (float)uVar10;
        box2.y = (float)uVar9;
        box2.x = (float)uVar8;
        local_98 = local_100.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar17].score;
        box2.score = local_98;
        fVar20 = find_IOU(*pBVar1,box2);
        if (fVar20 < local_108) goto LAB_00105b60;
        pBVar1 = pBVar14 + iVar17;
        if (pBVar2 == local_158.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Boundingbox,std::allocator<Boundingbox>>::
          _M_realloc_insert<Boundingbox_const&>
                    ((vector<Boundingbox,std::allocator<Boundingbox>> *)&local_158,(iterator)pBVar2,
                     pBVar1);
        }
        else {
          pBVar2->score = pBVar1->score;
          fVar20 = pBVar1->y;
          fVar21 = pBVar1->w;
          fVar12 = pBVar1->h;
          pBVar2->x = pBVar1->x;
          pBVar2->y = fVar20;
          pBVar2->w = fVar21;
          pBVar2->h = fVar12;
          local_158.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_158.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl
               .super__Vector_impl_data._M_finish + 1;
        }
        if (local_158.max_score <
            local_100.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
            super__Vector_impl_data._M_start[iVar17].score) {
          local_158.max_score =
               local_100.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
               super__Vector_impl_data._M_start[iVar17].score;
        }
        pBVar2 = local_100.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar17 + 1;
        if (pBVar2 != local_100.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
          memmove(local_100.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                  super__Vector_impl_data._M_start + iVar17,pBVar2,
                  (long)local_100.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pBVar2);
        }
        local_100.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_100.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
        pTVar15 = local_128.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar13;
        std::vector<Boundingbox,_std::allocator<Boundingbox>_>::operator=
                  (&pTVar15->boxes,&local_158.boxes);
        pTVar15->track_id = local_158.track_id;
        pTVar15->max_score = local_158.max_score;
        pTVar15->start_frame = local_158.start_frame;
        local_160 = local_160 + 1;
      }
      if (local_158.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_158.boxes.
                        super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      uVar13 = (ulong)local_160;
      uVar18 = ((long)local_128.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_128.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    } while (uVar13 <= uVar18 && uVar18 - uVar13 != 0);
  }
  pBVar2 = local_100.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_100.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_100.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pBVar14 = local_100.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_e8.score = pBVar14->score;
      local_e8.x = pBVar14->x;
      local_e8.y = pBVar14->y;
      local_e8.w = pBVar14->w;
      local_e8.h = pBVar14->h;
      local_c8 = (void *)0x0;
      uStack_c0 = 0;
      local_b8 = 0;
      std::vector<Boundingbox,std::allocator<Boundingbox>>::_M_realloc_insert<Boundingbox_const&>
                ((vector<Boundingbox,std::allocator<Boundingbox>> *)&local_c8,(iterator)0x0,
                 &local_e8);
      std::vector<Boundingbox,_std::allocator<Boundingbox>_>::vector
                (&local_158.boxes,(vector<Boundingbox,_std::allocator<Boundingbox>_> *)&local_c8);
      local_158.max_score = local_e8.score;
      local_158.start_frame = 0;
      local_158.track_id = 0;
      std::vector<Track,_std::allocator<Track>_>::push_back(&local_128,&local_158);
      if (local_158.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_158.boxes.
                        super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_c8 != (void *)0x0) {
        operator_delete(local_c8);
      }
      pBVar14 = pBVar14 + 1;
    } while (pBVar14 != pBVar2);
  }
  pTVar15 = local_128.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (local_128.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_128.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    __x = local_128.super__Vector_base<Track,_std::allocator<Track>_>._M_impl.
          super__Vector_impl_data._M_start;
    do {
      std::vector<Boundingbox,_std::allocator<Boundingbox>_>::vector(&local_158.boxes,&__x->boxes);
      local_158.track_id = __x->track_id;
      uVar5 = __x->max_score;
      uVar7 = __x->start_frame;
      local_158.max_score = (float)uVar5;
      local_158.start_frame = uVar7;
      if ((sigma_h <= (float)uVar5) &&
         (local_b0 <=
          (ulong)(((long)local_158.boxes.
                         super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_158.boxes.
                         super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2) * -0x3333333333333333))) {
        std::vector<Track,_std::allocator<Track>_>::push_back(local_130,&local_158);
      }
      if (local_158.boxes.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_158.boxes.
                        super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      __x = __x + 1;
    } while (__x != pTVar15);
  }
  if (local_100.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.super__Vector_base<Boundingbox,_std::allocator<Boundingbox>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<Track,_std::allocator<Track>_>::~vector(&local_128);
  return local_130;
}

Assistant:

std::vector< Track > IOU_tracker(float sigma_l, float sigma_h, float sigma_iou, int t_min, std::vector< std::vector<Boundingbox> > detections)
{
	
	int index;
	bool updated;

	// initiate active tracks, finished tracks
	std::vector<Track> active_tracks;
	std::vector<Track> finished_tracks;

	// do for all the frames
	for (int frame_no = 0; frame_no < detections.size(); frame_no++)
	{
		// get detections from the frame
		std::vector<Boundingbox> frame_boxes = detections[frame_no];

		// for each track in active tracks
		for (int i = 0; i < active_tracks.size(); i++)
		{
			Track track = active_tracks[i];
			updated = false;
			// the index of box with highest iou
			index = Highest_iou(track.boxes.back(), frame_boxes);

			// if no box is found or 
			if (index != -1 && find_IOU(track.boxes.back(), frame_boxes[index]) >= sigma_iou)
			{
				track.boxes.push_back(frame_boxes[index]);

				if (track.max_score < frame_boxes[index].score)
				{
					// update the score in tracks
					track.max_score = frame_boxes[index].score;
				}
				frame_boxes.erase(frame_boxes.begin() + index);

				// updating the track
				active_tracks[i] = track;
				updated = true;
			}

			// if not updated, append them into finished tracks
			if (!updated)
			{
				if (track.max_score > sigma_h && track.boxes.size() > t_min)
				{
					finished_tracks.push_back(track);	
				}
				// 
				active_tracks.erase(active_tracks.begin() + i);

				i--;
			}
		}

		// add new tracks in active tracks
		for ( auto box : frame_boxes)
		{
			std::vector<Boundingbox> new_box;

			new_box.push_back(box);

			Track t = {new_box, box.score, frame_no, 0};
			
			active_tracks.push_back(t);
		}

		// creating new tracks
		for (auto track : active_tracks)
		{
			if (track.max_score >= sigma_h && track.boxes.size() >= t_min)
			{
				finished_tracks.push_back(track);
			}
		}

		return finished_tracks;

	}
}